

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v11::format_facet<std::locale>::format_facet(format_facet<std::locale> *this,locale *loc)

{
  bool bVar1;
  undefined1 uVar2;
  locale *in_RSI;
  facet *in_RDI;
  facet *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  numpunct<char> *np;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  allocator<char> local_69 [49];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::locale::facet::facet(in_RDI,0);
  *(undefined ***)in_RDI = &PTR__format_facet_00d82b90;
  __a = in_RDI + 0x10;
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  __c = (char)((ulong)(in_RDI + 0x30) >> 0x38);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x50);
  std::__cxx11::string::string(this_00);
  std::use_facet<std::__cxx11::numpunct<char>>(in_RSI);
  std::__cxx11::numpunct<char>::grouping();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa60610);
  if (!bVar1) {
    uVar2 = std::__cxx11::numpunct<char>::thousands_sep();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(size_type)in_RDI,__c,(allocator<char> *)__a);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff60));
    std::allocator<char>::~allocator(local_69);
  }
  return;
}

Assistant:

format_facet<Locale>::format_facet(Locale& loc) {
  auto& np = detail::use_facet<detail::numpunct<char>>(loc);
  grouping_ = np.grouping();
  if (!grouping_.empty()) separator_ = std::string(1, np.thousands_sep());
}